

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O1

void character(void)

{
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Assert local_1a0;
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  local_1c0._M_dataplus._M_p._0_1_ = 99;
  std::__ostream_insert<char,std::char_traits<char>>(local_180,(char *)&local_1c0,1);
  local_1a0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1a0.m_line = 0x2b;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[2],std::__cxx11::string>
            (&local_1a0,(char (*) [2])0x1156b0,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_) !=
      &local_1c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c0._M_dataplus._M_p._1_7_,local_1c0._M_dataplus._M_p._0_1_),
                    local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST(character)
{
    auto i  = 'c';
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(i);
    ASSERT_EQUALS("c", ss.str());
}